

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_OverlapSequenceChecks::_Run(_Test_OverlapSequenceChecks *this)

{
  bool bVar1;
  Tester TStack_1a8;
  
  FindFileTest::Add(&this->super_FindFileTest,"200","200",5000,3000);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x97);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"199","199");
  test::Tester::Is(&TStack_1a8,!bVar1,"!Overlaps(\"199\", \"199\")");
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x98);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"201","300");
  test::Tester::Is(&TStack_1a8,!bVar1,"!Overlaps(\"201\", \"300\")");
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x99);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"200","200");
  test::Tester::Is(&TStack_1a8,bVar1,"Overlaps(\"200\", \"200\")");
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x9a);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"190","200");
  test::Tester::Is(&TStack_1a8,bVar1,"Overlaps(\"190\", \"200\")");
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x9b);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"200","210");
  test::Tester::Is(&TStack_1a8,bVar1,"Overlaps(\"200\", \"210\")");
  test::Tester::~Tester(&TStack_1a8);
  return;
}

Assistant:

TEST(FindFileTest, OverlapSequenceChecks) {
  Add("200", "200", 5000, 3000);
  ASSERT_TRUE(!Overlaps("199", "199"));
  ASSERT_TRUE(!Overlaps("201", "300"));
  ASSERT_TRUE(Overlaps("200", "200"));
  ASSERT_TRUE(Overlaps("190", "200"));
  ASSERT_TRUE(Overlaps("200", "210"));
}